

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDyndepCollation.cxx
# Opt level: O0

Value * anon_unknown.dwarf_10a3caa::CollationInformationExports
                  (Value *__return_storage_ptr__,cmGeneratorTarget *gt)

{
  bool bVar1;
  cmGlobalGenerator *this;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
  *this_00;
  reference ppVar2;
  vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
  *this_01;
  reference ppcVar3;
  vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  *this_02;
  pointer pcVar4;
  string *psVar5;
  Value *pVVar6;
  Value local_468;
  Value local_440;
  Value local_418;
  Value local_3f0;
  Value local_3c8;
  Value local_3a0;
  string local_378;
  string *local_358;
  string *export_prefix_1;
  string dest_1;
  string *cxxm_dir_1;
  string *main_fn;
  String *local_300;
  string *ns_1;
  Value tdi_export_info_1;
  anon_class_32_1_898f2789_for__M_pred local_2c8;
  __normal_iterator<cmExportBuildFileGenerator::TargetExport_*,_std::vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>_>
  local_2a8;
  __normal_iterator<cmExportBuildFileGenerator::TargetExport_*,_std::vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>_>
  local_2a0;
  undefined1 local_291;
  string *psStack_290;
  bool has_current_target;
  string *name;
  vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
  targets_1;
  unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_> *exp_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  *__range1_1;
  vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
  *all_build_exports;
  Value local_220;
  Value local_1f8;
  Value local_1d0;
  Value local_1a8;
  Value local_180;
  string local_158;
  string *local_138;
  string *export_prefix;
  String *local_110;
  string *cxxm_dir;
  string *dest;
  string *ns;
  Value tdi_export_info;
  cmInstallExportGenerator *install;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
  *__range2;
  vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
  *installs;
  cmGeneratorTarget *local_a0;
  unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *local_98;
  __normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
  local_90;
  __normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
  local_88;
  __normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
  tgt_export;
  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
  *targets;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>
  *exp;
  const_iterator __end1;
  const_iterator __begin1;
  cmExportSetMap *__range1;
  cmExportSetMap *all_install_exports;
  undefined1 local_40 [8];
  string export_name;
  cmGeneratorTarget *gt_local;
  Value *tdi_exports;
  
  export_name.field_2._M_local_buf[0xf] = '\0';
  Json::Value::Value(__return_storage_ptr__,arrayValue);
  cmGeneratorTarget::GetExportName_abi_cxx11_((string *)local_40,gt);
  this = cmGeneratorTarget::GetGlobalGenerator(gt);
  this_00 = &cmGlobalGenerator::GetExportSets(this)->
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
  ;
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
           ::begin(this_00);
  exp = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>
         *)std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>_>
           ::end(this_00);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&exp), bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>
             ::operator*(&__end1);
    tgt_export._M_current =
         (unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *)
         cmExportSet::GetTargetExports(&ppVar2->second);
    local_90._M_current =
         (unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *)
         std::
         vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
         ::begin((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                  *)tgt_export._M_current);
    local_98 = (unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_> *)
               std::
               vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
               ::end((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                      *)tgt_export._M_current);
    local_a0 = gt;
    local_88 = std::
               find_if<__gnu_cxx::__normal_iterator<std::unique_ptr<cmTargetExport,std::default_delete<cmTargetExport>>const*,std::vector<std::unique_ptr<cmTargetExport,std::default_delete<cmTargetExport>>,std::allocator<std::unique_ptr<cmTargetExport,std::default_delete<cmTargetExport>>>>>,(anonymous_namespace)::CollationInformationExports(cmGeneratorTarget_const*)::__0>
                         (local_90,(__normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
                                    )local_98,(anon_class_8_1_3fcf65ab_for__M_pred)gt);
    installs = (vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
                *)std::
                  vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                  ::end((vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>
                         *)tgt_export._M_current);
    bVar1 = __gnu_cxx::operator==
                      (&local_88,
                       (__normal_iterator<const_std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_*,_std::vector<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>,_std::allocator<std::unique_ptr<cmTargetExport,_std::default_delete<cmTargetExport>_>_>_>_>
                        *)&installs);
    if (!bVar1) {
      this_01 = cmExportSet::GetInstallations(&ppVar2->second);
      __end2 = std::
               vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
               ::begin(this_01);
      install = (cmInstallExportGenerator *)
                std::
                vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>
                ::end(this_01);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<const_cmInstallExportGenerator_*const_*,_std::vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>_>
                                         *)&install), bVar1) {
        ppcVar3 = __gnu_cxx::
                  __normal_iterator<const_cmInstallExportGenerator_*const_*,_std::vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>_>
                  ::operator*(&__end2);
        tdi_export_info.limit_ = (ptrdiff_t)*ppcVar3;
        Json::Value::Value((Value *)&ns,objectValue);
        dest = cmInstallExportGenerator::GetNamespace_abi_cxx11_
                         ((cmInstallExportGenerator *)tdi_export_info.limit_);
        cxxm_dir = cmInstallExportGenerator::GetDestination_abi_cxx11_
                             ((cmInstallExportGenerator *)tdi_export_info.limit_);
        cmInstallExportGenerator::GetCxxModuleDirectory_abi_cxx11_
                  ((string *)&export_prefix,(cmInstallExportGenerator *)tdi_export_info.limit_);
        local_110 = (String *)&export_prefix;
        cmInstallExportGenerator::GetTempDir_abi_cxx11_
                  (&local_158,(cmInstallExportGenerator *)tdi_export_info.limit_);
        local_138 = &local_158;
        Json::Value::Value(&local_180,dest);
        pVVar6 = Json::Value::operator[]((Value *)&ns,"namespace");
        Json::Value::operator=(pVVar6,&local_180);
        Json::Value::~Value(&local_180);
        Json::Value::Value(&local_1a8,(String *)local_40);
        pVVar6 = Json::Value::operator[]((Value *)&ns,"export-name");
        Json::Value::operator=(pVVar6,&local_1a8);
        Json::Value::~Value(&local_1a8);
        Json::Value::Value(&local_1d0,cxxm_dir);
        pVVar6 = Json::Value::operator[]((Value *)&ns,"destination");
        Json::Value::operator=(pVVar6,&local_1d0);
        Json::Value::~Value(&local_1d0);
        Json::Value::Value(&local_1f8,local_110);
        pVVar6 = Json::Value::operator[]((Value *)&ns,"cxx-module-info-dir");
        Json::Value::operator=(pVVar6,&local_1f8);
        Json::Value::~Value(&local_1f8);
        Json::Value::Value(&local_220,local_138);
        pVVar6 = Json::Value::operator[]((Value *)&ns,"export-prefix");
        Json::Value::operator=(pVVar6,&local_220);
        Json::Value::~Value(&local_220);
        Json::Value::Value((Value *)&all_build_exports,true);
        pVVar6 = Json::Value::operator[]((Value *)&ns,"install");
        Json::Value::operator=(pVVar6,(Value *)&all_build_exports);
        Json::Value::~Value((Value *)&all_build_exports);
        Json::Value::append(__return_storage_ptr__,(Value *)&ns);
        std::__cxx11::string::~string((string *)&local_158);
        std::__cxx11::string::~string((string *)&export_prefix);
        Json::Value::~Value((Value *)&ns);
        __gnu_cxx::
        __normal_iterator<const_cmInstallExportGenerator_*const_*,_std::vector<const_cmInstallExportGenerator_*,_std::allocator<const_cmInstallExportGenerator_*>_>_>
        ::operator++(&__end2);
      }
    }
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmExportSet>_>
    ::operator++(&__end1);
  }
  this_02 = cmMakefile::GetExportBuildFileGenerators(gt->Makefile);
  __end1_1 = std::
             vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
             ::begin(this_02);
  exp_1 = (unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
           *)std::
             vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>
             ::end(this_02);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_*,_std::vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>_>
                             *)&exp_1), bVar1) {
    targets_1.
    super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         (pointer)__gnu_cxx::
                  __normal_iterator<const_std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_*,_std::vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>_>
                  ::operator*(&__end1_1);
    std::
    vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ::vector((vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
              *)&name);
    pcVar4 = std::
             unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
             ::operator->((unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                           *)targets_1.
                             super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
    cmExportBuildFileGenerator::GetTargets
              (pcVar4,(vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                       *)&name);
    psStack_290 = cmGeneratorTarget::GetName_abi_cxx11_(gt);
    local_2a0._M_current =
         (TargetExport *)
         std::
         vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
         ::begin((vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                  *)&name);
    local_2a8._M_current =
         (TargetExport *)
         std::
         vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
         ::end((vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                *)&name);
    std::__cxx11::string::string((string *)&local_2c8,(string *)psStack_290);
    bVar1 = std::
            any_of<__gnu_cxx::__normal_iterator<cmExportBuildFileGenerator::TargetExport*,std::vector<cmExportBuildFileGenerator::TargetExport,std::allocator<cmExportBuildFileGenerator::TargetExport>>>,(anonymous_namespace)::CollationInformationExports(cmGeneratorTarget_const*)::__1>
                      (local_2a0,local_2a8,&local_2c8);
    (anonymous_namespace)::CollationInformationExports(cmGeneratorTarget_const*)::$_1::~__1
              ((__1 *)&local_2c8);
    local_291 = bVar1;
    if (bVar1) {
      Json::Value::Value((Value *)&ns_1,objectValue);
      pcVar4 = std::
               unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
               ::operator->((unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                             *)targets_1.
                               super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      cmExportFileGenerator::GetNamespace_abi_cxx11_
                ((string *)&main_fn,&pcVar4->super_cmExportFileGenerator);
      local_300 = (String *)&main_fn;
      pcVar4 = std::
               unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
               ::operator->((unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                             *)targets_1.
                               super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      psVar5 = cmExportFileGenerator::GetMainExportFileName_abi_cxx11_
                         (&pcVar4->super_cmExportFileGenerator);
      pcVar4 = std::
               unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
               ::operator->((unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                             *)targets_1.
                               super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      dest_1.field_2._8_8_ = cmExportBuildFileGenerator::GetCxxModuleDirectory_abi_cxx11_(pcVar4);
      cmsys::SystemTools::GetParentDirectory((string *)&export_prefix_1,psVar5);
      pcVar4 = std::
               unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
               ::operator->((unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>
                             *)targets_1.
                               super__Vector_base<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
      psVar5 = cmExportFileGenerator::GetMainExportFileName_abi_cxx11_
                         (&pcVar4->super_cmExportFileGenerator);
      cmsys::SystemTools::GetFilenamePath(&local_378,psVar5);
      local_358 = &local_378;
      Json::Value::Value(&local_3a0,local_300);
      pVVar6 = Json::Value::operator[]((Value *)&ns_1,"namespace");
      Json::Value::operator=(pVVar6,&local_3a0);
      Json::Value::~Value(&local_3a0);
      Json::Value::Value(&local_3c8,(String *)local_40);
      pVVar6 = Json::Value::operator[]((Value *)&ns_1,"export-name");
      Json::Value::operator=(pVVar6,&local_3c8);
      Json::Value::~Value(&local_3c8);
      Json::Value::Value(&local_3f0,(String *)&export_prefix_1);
      pVVar6 = Json::Value::operator[]((Value *)&ns_1,"destination");
      Json::Value::operator=(pVVar6,&local_3f0);
      Json::Value::~Value(&local_3f0);
      Json::Value::Value(&local_418,(String *)dest_1.field_2._8_8_);
      pVVar6 = Json::Value::operator[]((Value *)&ns_1,"cxx-module-info-dir");
      Json::Value::operator=(pVVar6,&local_418);
      Json::Value::~Value(&local_418);
      Json::Value::Value(&local_440,local_358);
      pVVar6 = Json::Value::operator[]((Value *)&ns_1,"export-prefix");
      Json::Value::operator=(pVVar6,&local_440);
      Json::Value::~Value(&local_440);
      Json::Value::Value(&local_468,false);
      pVVar6 = Json::Value::operator[]((Value *)&ns_1,"install");
      Json::Value::operator=(pVVar6,&local_468);
      Json::Value::~Value(&local_468);
      Json::Value::append(__return_storage_ptr__,(Value *)&ns_1);
      std::__cxx11::string::~string((string *)&local_378);
      std::__cxx11::string::~string((string *)&export_prefix_1);
      std::__cxx11::string::~string((string *)&main_fn);
      Json::Value::~Value((Value *)&ns_1);
      tdi_export_info_1.limit_._4_4_ = 0;
    }
    else {
      tdi_export_info_1.limit_._4_4_ = 7;
    }
    std::
    vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
    ::~vector((vector<cmExportBuildFileGenerator::TargetExport,_std::allocator<cmExportBuildFileGenerator::TargetExport>_>
               *)&name);
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_*,_std::vector<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>,_std::allocator<std::unique_ptr<cmExportBuildFileGenerator,_std::default_delete<cmExportBuildFileGenerator>_>_>_>_>
    ::operator++(&__end1_1);
  }
  export_name.field_2._M_local_buf[0xf] = '\x01';
  tdi_export_info_1.limit_._4_4_ = 1;
  std::__cxx11::string::~string((string *)local_40);
  if ((export_name.field_2._M_local_buf[0xf] & 1U) == 0) {
    Json::Value::~Value(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Json::Value CollationInformationExports(cmGeneratorTarget const* gt)
{
  Json::Value tdi_exports = Json::arrayValue;
  std::string export_name = gt->GetExportName();

  auto const& all_install_exports = gt->GetGlobalGenerator()->GetExportSets();
  for (auto const& exp : all_install_exports) {
    // Ignore exports sets which are not for this target.
    auto const& targets = exp.second.GetTargetExports();
    auto tgt_export =
      std::find_if(targets.begin(), targets.end(),
                   [gt](std::unique_ptr<cmTargetExport> const& te) {
                     return te->Target == gt;
                   });
    if (tgt_export == targets.end()) {
      continue;
    }

    auto const* installs = exp.second.GetInstallations();
    for (auto const* install : *installs) {
      Json::Value tdi_export_info = Json::objectValue;

      auto const& ns = install->GetNamespace();
      auto const& dest = install->GetDestination();
      auto const& cxxm_dir = install->GetCxxModuleDirectory();
      auto const& export_prefix = install->GetTempDir();

      tdi_export_info["namespace"] = ns;
      tdi_export_info["export-name"] = export_name;
      tdi_export_info["destination"] = dest;
      tdi_export_info["cxx-module-info-dir"] = cxxm_dir;
      tdi_export_info["export-prefix"] = export_prefix;
      tdi_export_info["install"] = true;

      tdi_exports.append(tdi_export_info);
    }
  }

  auto const& all_build_exports = gt->Makefile->GetExportBuildFileGenerators();
  for (auto const& exp : all_build_exports) {
    std::vector<cmExportBuildFileGenerator::TargetExport> targets;
    exp->GetTargets(targets);

    // Ignore exports sets which are not for this target.
    auto const& name = gt->GetName();
    bool has_current_target =
      std::any_of(targets.begin(), targets.end(),
                  [name](cmExportBuildFileGenerator::TargetExport const& te) {
                    return te.Name == name;
                  });
    if (!has_current_target) {
      continue;
    }

    Json::Value tdi_export_info = Json::objectValue;

    auto const& ns = exp->GetNamespace();
    auto const& main_fn = exp->GetMainExportFileName();
    auto const& cxxm_dir = exp->GetCxxModuleDirectory();
    auto dest = cmsys::SystemTools::GetParentDirectory(main_fn);
    auto const& export_prefix =
      cmSystemTools::GetFilenamePath(exp->GetMainExportFileName());

    tdi_export_info["namespace"] = ns;
    tdi_export_info["export-name"] = export_name;
    tdi_export_info["destination"] = dest;
    tdi_export_info["cxx-module-info-dir"] = cxxm_dir;
    tdi_export_info["export-prefix"] = export_prefix;
    tdi_export_info["install"] = false;

    tdi_exports.append(tdi_export_info);
  }

  return tdi_exports;
}